

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O0

void sc_dt::scfx_rep::operator_delete(void *ptr,size_t size)

{
  long in_RSI;
  undefined8 *in_RDI;
  scfx_rep_node *node;
  
  if (in_RSI == 0x28) {
    *in_RDI = list;
    list = in_RDI;
  }
  else {
    ::operator_delete(in_RDI);
  }
  return;
}

Assistant:

void scfx_rep::operator delete( void* ptr, std::size_t size )
{
    if( size != sizeof( scfx_rep ) )
    {
	::operator delete( ptr );
	return;
    }

    scfx_rep_node* node = static_cast<scfx_rep_node*>( ptr );
    node->next = list;
    list = node;
}